

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

bool __thiscall FCompressedFile::Open(FCompressedFile *this,char *name,EOpenMode mode)

{
  FILE *pFVar1;
  char *local_40;
  EOpenMode mode_local;
  char *name_local;
  FCompressedFile *this_local;
  
  (*(this->super_FFile)._vptr_FFile[3])();
  if (name == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this->m_Mode = mode;
    if (mode == EReading) {
      local_40 = "rb";
    }
    else {
      local_40 = "wb";
    }
    pFVar1 = fopen(name,local_40);
    this->m_File = (FILE *)pFVar1;
    PostOpen(this);
    this_local._7_1_ = this->m_File != (FILE *)0x0;
  }
  return this_local._7_1_;
}

Assistant:

bool FCompressedFile::Open (const char *name, EOpenMode mode)
{
	Close ();
	if (name == NULL)
		return false;
	m_Mode = mode;
	m_File = fopen (name, mode == EReading ? "rb" : "wb");
	PostOpen ();
	return !!m_File;
}